

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiCutFab.cpp
# Opt level: O1

bool __thiscall amrex::MultiCutFab::ok(MultiCutFab *this,MFIter *mfi)

{
  int *piVar1;
  
  piVar1 = &mfi->currentIndex;
  if (mfi->local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
    piVar1 = (mfi->local_index_map->super_vector<int,_std::allocator<int>_>).
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
             + *piVar1;
  }
  return *(int *)&((this->m_cellflags->m_fabs_v).
                   super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[*piVar1]->
                  super_BaseFab<amrex::EBCellFlag>).field_0x44 == 1;
}

Assistant:

bool
MultiCutFab::ok (const MFIter& mfi) const noexcept
{
    return (*m_cellflags)[mfi].getType() == FabType::singlevalued;
}